

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O2

QImage * __thiscall
QRasterPlatformPixmap::toImage(QImage *__return_storage_ptr__,QRasterPlatformPixmap *this)

{
  QImage *this_00;
  long lVar1;
  QPaintEngine *this_01;
  bool bVar2;
  QPaintDevice *pQVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->image;
  bVar2 = QImage::isNull(this_00);
  if ((((bVar2) || (this_01 = ((this->image).d)->paintEngine, this_01 == (QPaintEngine *)0x0)) ||
      ((this_01->field_0x14 & 1) == 0)) ||
     (pQVar3 = QPaintEngine::paintDevice(this_01), (QImage *)pQVar3 != this_00)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QImage::QImage(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  else {
    QImage::copy(__return_storage_ptr__,(QRect *)this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QImage QRasterPlatformPixmap::toImage() const
{
    if (!image.isNull()) {
        QImageData *data = const_cast<QImage &>(image).data_ptr();
        if (data->paintEngine && data->paintEngine->isActive()
            && data->paintEngine->paintDevice() == &image)
        {
            return image.copy();
        }
    }

    return image;
}